

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebugger.h
# Opt level: O3

int __thiscall
DebuggerTestHelper::bind(DebuggerTestHelper *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Session *pSVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int iVar2;
  code *pcVar3;
  shared_ptr<dap::ReaderWriter> server2client;
  shared_ptr<dap::ReaderWriter> client2server;
  long local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  long local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  long local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  dap::pipe((int *)&local_20);
  dap::pipe((int *)&local_30);
  pSVar1 = (this->Client)._M_t.
           super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
           super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
           super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl;
  local_68 = local_30;
  local_60 = local_28;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  local_78 = local_20 + 8;
  if (local_20 == 0) {
    local_78 = 0;
  }
  local_70 = local_18;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  (*pSVar1->_vptr_Session[4])(pSVar1,&local_68,&local_78);
  (*pSVar1->_vptr_Session[5])(pSVar1,&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  pSVar1 = (this->Debugger)._M_t.
           super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
           super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
           super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl;
  local_68 = local_20;
  local_60 = local_18;
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_18->_M_use_count = local_18->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_18->_M_use_count = local_18->_M_use_count + 1;
    }
  }
  local_78 = local_30 + 8;
  if (local_30 == 0) {
    local_78 = 0;
  }
  local_70 = local_28;
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_28->_M_use_count = local_28->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_28->_M_use_count = local_28->_M_use_count + 1;
    }
  }
  local_48 = (code *)0x0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  (*pSVar1->_vptr_Session[4])(pSVar1,&local_68,&local_78);
  (*pSVar1->_vptr_Session[5])(pSVar1,&local_58);
  pcVar3 = local_48;
  if (local_48 != (code *)0x0) {
    pcVar3 = (code *)(*local_48)(&local_58,&local_58,3);
  }
  iVar2 = (int)pcVar3;
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
    iVar2 = extraout_EAX;
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
    iVar2 = extraout_EAX_00;
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    iVar2 = extraout_EAX_01;
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    iVar2 = extraout_EAX_02;
  }
  return iVar2;
}

Assistant:

void bind()
  {
    auto client2server = dap::pipe();
    auto server2client = dap::pipe();
    Client->bind(server2client, client2server);
    Debugger->bind(client2server, server2client);
  }